

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawCreateInfoUtil.cpp
# Opt level: O3

void __thiscall
vkt::Draw::RenderPassCreateInfo::addAttachment
          (RenderPassCreateInfo *this,VkAttachmentDescription attachment)

{
  iterator __position;
  pointer pVVar1;
  pointer pVVar2;
  __normal_iterator<vkt::Draw::AttachmentDescription_*,_std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>_>
  __last;
  allocator_type local_39;
  undefined1 local_38 [8];
  undefined8 uStack_30;
  pointer local_28;
  VkAttachmentStoreOp VStack_20;
  VkImageLayout VStack_1c;
  VkImageLayout local_18;
  
  local_38._0_4_ = attachment.flags;
  local_38._4_4_ = attachment.format;
  uStack_30 = (pointer)attachment._8_8_;
  local_28 = (pointer)attachment._16_8_;
  VStack_20 = attachment.stencilStoreOp;
  VStack_1c = attachment.initialLayout;
  local_18 = attachment.finalLayout;
  __position._M_current =
       (this->m_attachments).
       super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->m_attachments).
      super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
    ::_M_realloc_insert<vkt::Draw::AttachmentDescription>
              (&this->m_attachments,__position,(AttachmentDescription *)local_38);
    __last._M_current =
         (this->m_attachments).
         super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    ((__position._M_current)->super_VkAttachmentDescription).finalLayout = attachment.finalLayout;
    ((__position._M_current)->super_VkAttachmentDescription).storeOp = attachment.storeOp;
    ((__position._M_current)->super_VkAttachmentDescription).stencilLoadOp =
         attachment.stencilLoadOp;
    ((__position._M_current)->super_VkAttachmentDescription).stencilStoreOp =
         attachment.stencilStoreOp;
    ((__position._M_current)->super_VkAttachmentDescription).initialLayout =
         attachment.initialLayout;
    ((__position._M_current)->super_VkAttachmentDescription).flags = attachment.flags;
    ((__position._M_current)->super_VkAttachmentDescription).format = attachment.format;
    ((__position._M_current)->super_VkAttachmentDescription).samples = attachment.samples;
    ((__position._M_current)->super_VkAttachmentDescription).loadOp = attachment.loadOp;
    __last._M_current =
         (this->m_attachments).
         super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
         ._M_impl.super__Vector_impl_data._M_finish + 1;
    (this->m_attachments).
    super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
    ._M_impl.super__Vector_impl_data._M_finish = __last._M_current;
  }
  std::vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>>::
  vector<__gnu_cxx::__normal_iterator<vkt::Draw::AttachmentDescription*,std::vector<vkt::Draw::AttachmentDescription,std::allocator<vkt::Draw::AttachmentDescription>>>,void>
            ((vector<vk::VkAttachmentDescription,std::allocator<vk::VkAttachmentDescription>> *)
             local_38,(this->m_attachments).
                      super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                      ._M_impl.super__Vector_impl_data._M_start,__last,&local_39);
  pVVar1 = (this->m_attachmentsStructs).
           super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (this->m_attachmentsStructs).
           super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->m_attachmentsStructs).
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)local_38;
  (this->m_attachmentsStructs).
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_finish = uStack_30;
  (this->m_attachmentsStructs).
  super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = local_28;
  local_38 = (undefined1  [8])0x0;
  uStack_30._0_4_ = 0;
  uStack_30._4_4_ = VK_ATTACHMENT_LOAD_OP_LOAD;
  local_28 = (pointer)0x0;
  if (pVVar1 != (pointer)0x0) {
    operator_delete(pVVar1,(long)pVVar2 - (long)pVVar1);
    if (local_38 != (undefined1  [8])0x0) {
      operator_delete((void *)local_38,(long)local_28 - (long)local_38);
    }
  }
  pVVar1 = (this->m_attachmentsStructs).
           super__Vector_base<vk::VkAttachmentDescription,_std::allocator<vk::VkAttachmentDescription>_>
           ._M_impl.super__Vector_impl_data._M_start;
  (this->super_VkRenderPassCreateInfo).attachmentCount =
       (int)((ulong)((long)(this->m_attachments).
                           super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->m_attachments).
                          super__Vector_base<vkt::Draw::AttachmentDescription,_std::allocator<vkt::Draw::AttachmentDescription>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 2) * 0x38e38e39;
  (this->super_VkRenderPassCreateInfo).pAttachments = pVVar1;
  return;
}

Assistant:

void
RenderPassCreateInfo::addAttachment (vk::VkAttachmentDescription attachment)
{

	m_attachments.push_back(attachment);
	m_attachmentsStructs	= std::vector<vk::VkAttachmentDescription>(m_attachments.begin(), m_attachments.end());
	attachmentCount			= static_cast<deUint32>(m_attachments.size());
	pAttachments			= &m_attachmentsStructs[0];
}